

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFabUtil.cpp
# Opt level: O3

void amrex::average_down_faces(MultiFab *fine,MultiFab *crse,IntVect *ratio,int ngcrse)

{
  DistributionMapping *this;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  FabArray<amrex::FArrayBox> *pFVar5;
  FabArray<amrex::FArrayBox> *pFVar6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  Periodicity *period;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  double dVar15;
  uint local_324;
  ulong local_320;
  int local_314;
  long local_2f8;
  int kk;
  undefined1 local_2d0 [24];
  pointer local_2b8;
  undefined8 uStack_2b0;
  int local_2a8;
  long local_290;
  int jj;
  undefined8 local_280;
  int local_278;
  uint local_274;
  uint local_270;
  int local_26c;
  FabArray<amrex::FArrayBox> *local_260;
  FabArray<amrex::FArrayBox> *local_258;
  IntVect *local_250;
  ulong local_248;
  long local_240;
  ulong local_238;
  long local_230;
  long local_228;
  long local_220;
  BoxArray local_218;
  MFIter mfi;
  
  uVar8 = 0;
  switch((fine->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_bat.m_bat_type) {
  case null:
  case coarsenRatio:
    break;
  case indexType:
  case indexType_coarsenRatio:
    uVar8 = *(uint *)&(fine->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_bat.
                      m_op;
    break;
  default:
    uVar8 = *(uint *)((long)&(fine->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.
                             m_bat.m_op + 4);
  }
  local_324 = 0;
  do {
    if ((uVar8 >> (local_324 & 0x1f) & 1) != 0) {
      if ((uVar8 & ~(1 << ((byte)local_324 & 0x1f))) == 0) goto LAB_004838b4;
      goto LAB_004838a8;
    }
    local_324 = local_324 + 1;
  } while (local_324 != 3);
  local_324 = 3;
LAB_004838a8:
  Abort_host("average_down_faces: not face index type");
LAB_004838b4:
  uVar8 = (crse->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp;
  this = &(fine->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap;
  bVar7 = DistributionMapping::operator==
                    (this,&(crse->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
                           distributionMap);
  if ((bVar7) &&
     ((fine->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_ref.
      super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (crse->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_ref.
      super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr)) {
    local_250 = ratio;
    MFIter::MFIter(&mfi,(FabArrayBase *)crse,true);
    pFVar5 = &fine->super_FabArray<amrex::FArrayBox>;
    pFVar6 = &crse->super_FabArray<amrex::FArrayBox>;
    if (mfi.currentIndex < mfi.endIndex) {
      do {
        local_258 = pFVar6;
        local_260 = pFVar5;
        pFVar6 = local_258;
        pFVar5 = local_260;
        MFIter::growntilebox((Box *)&local_280,&mfi,ngcrse);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)&local_218,pFVar6,&mfi);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((Array4<const_double> *)local_2d0,pFVar5,&mfi);
        if (0 < (int)uVar8) {
          local_238 = (ulong)local_274;
          local_248 = (ulong)local_270;
          local_290 = (long)local_280._4_4_;
          local_320 = 0;
          do {
            iVar4 = local_278;
            if (local_278 <= local_26c) {
              do {
                if (local_280._4_4_ <= (int)local_270) {
                  uVar1 = local_250->vect[0];
                  uVar2 = local_250->vect[1];
                  uVar3 = local_250->vect[2];
                  iVar9 = uVar3 * iVar4;
                  local_230 = (long)(int)uVar1;
                  local_240 = (long)(int)uVar2;
                  local_314 = uVar2 * local_280._4_4_;
                  local_2f8 = local_290;
                  do {
                    if ((int)local_280 <= (int)local_274) {
                      _jj = local_2f8 * local_240;
                      local_220 = (long)local_218.m_bat.m_op.m_bndryReg.m_loshft.vect[2];
                      local_228 = (local_2f8 - local_218.m_bat.m_op.m_bndryReg.m_hishft.vect[0]) *
                                  CONCAT44(local_218.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[0],
                                           local_218.m_bat.m_op.m_bndryReg.m_typ.itype) * 8 +
                                  CONCAT44(local_218.m_bat.m_op.m_indexType.m_typ.itype,
                                           local_218.m_bat.m_bat_type) +
                                  ((long)iVar4 -
                                  (long)local_218.m_bat.m_op.m_bndryReg.m_hishft.vect[1]) *
                                  local_218.m_bat.m_op._12_8_ * 8 +
                                  local_218.m_bat.m_op._20_8_ * local_320 * 8;
                      lVar11 = (long)(int)local_280;
                      iVar13 = uVar1 * (int)local_280;
                      do {
                        if (local_324 == 2) {
                          if ((int)uVar2 < 1) {
                            dVar15 = 0.0;
                          }
                          else {
                            dVar15 = 0.0;
                            uVar12 = 0;
                            do {
                              if (0 < (int)uVar1) {
                                uVar10 = (ulong)uVar1;
                                iVar14 = iVar13 - (int)uStack_2b0;
                                do {
                                  dVar15 = dVar15 + *(double *)
                                                     (local_2d0._0_8_ +
                                                     (((long)iVar9 - (long)local_2a8) *
                                                      local_2d0._16_8_ +
                                                     (long)local_2b8 * local_320 +
                                                     (long)(((int)_jj + (int)uVar12) -
                                                           uStack_2b0._4_4_) * local_2d0._8_8_ +
                                                     (long)iVar14) * 8);
                                  iVar14 = iVar14 + 1;
                                  uVar10 = uVar10 - 1;
                                } while (uVar10 != 0);
                              }
                              uVar12 = uVar12 + 1;
                            } while (uVar12 != uVar2);
                          }
                          dVar15 = dVar15 * (1.0 / (double)(int)(uVar2 * uVar1));
LAB_00483d2c:
                          *(double *)(local_228 + (lVar11 - local_220) * 8) = dVar15;
                        }
                        else {
                          if (local_324 == 1) {
                            if ((int)uVar3 < 1) {
                              dVar15 = 0.0;
                            }
                            else {
                              dVar15 = 0.0;
                              uVar12 = 0;
                              do {
                                if (0 < (int)uVar1) {
                                  uVar10 = (ulong)uVar1;
                                  iVar14 = iVar13 - (int)uStack_2b0;
                                  do {
                                    dVar15 = dVar15 + *(double *)
                                                       (local_2d0._0_8_ +
                                                       ((_jj - uStack_2b0._4_4_) * local_2d0._8_8_ +
                                                       (long)local_2b8 * local_320 +
                                                       (long)((iVar9 + (int)uVar12) - local_2a8) *
                                                       local_2d0._16_8_ + (long)iVar14) * 8);
                                    iVar14 = iVar14 + 1;
                                    uVar10 = uVar10 - 1;
                                  } while (uVar10 != 0);
                                }
                                uVar12 = uVar12 + 1;
                              } while (uVar12 != uVar3);
                            }
                            dVar15 = dVar15 * (1.0 / (double)(int)(uVar3 * uVar1));
                            goto LAB_00483d2c;
                          }
                          if (local_324 == 0) {
                            if ((int)uVar3 < 1) {
                              dVar15 = 0.0;
                            }
                            else {
                              dVar15 = 0.0;
                              uVar12 = 0;
                              do {
                                if (0 < (int)uVar2) {
                                  uVar10 = (ulong)uVar2;
                                  iVar14 = local_314 - uStack_2b0._4_4_;
                                  do {
                                    dVar15 = dVar15 + *(double *)
                                                       (local_2d0._0_8_ +
                                                       ((lVar11 * local_230 - (long)(int)uStack_2b0)
                                                       + (long)local_2b8 * local_320 +
                                                         (long)((iVar9 + (int)uVar12) - local_2a8) *
                                                         local_2d0._16_8_ +
                                                         local_2d0._8_8_ * (long)iVar14) * 8);
                                    iVar14 = iVar14 + 1;
                                    uVar10 = uVar10 - 1;
                                  } while (uVar10 != 0);
                                }
                                uVar12 = uVar12 + 1;
                              } while (uVar12 != uVar3);
                            }
                            dVar15 = dVar15 * (1.0 / (double)(int)(uVar3 * uVar2));
                            goto LAB_00483d2c;
                          }
                        }
                        lVar11 = lVar11 + 1;
                        iVar13 = iVar13 + uVar1;
                      } while (local_274 + 1 != (int)lVar11);
                    }
                    local_2f8 = local_2f8 + 1;
                    local_314 = local_314 + uVar2;
                  } while (local_270 + 1 != (int)local_2f8);
                }
                bVar7 = iVar4 != local_26c;
                iVar4 = iVar4 + 1;
              } while (bVar7);
            }
            local_320 = local_320 + 1;
          } while (local_320 != uVar8);
        }
        MFIter::operator++(&mfi);
        pFVar5 = local_260;
        pFVar6 = local_258;
      } while (mfi.currentIndex < mfi.endIndex);
    }
    MFIter::~MFIter(&mfi);
  }
  else {
    coarsen(&local_218,&(fine->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray,ratio);
    local_2d0._0_8_ = (double *)0x1;
    local_2d0._8_8_ = (Arena *)0x0;
    local_2d0._16_8_ = (pointer)0x0;
    local_2b8 = (pointer)0x0;
    uStack_2b0 = (pointer)0x0;
    local_280 = &PTR__FabFactory_00712918;
    MultiFab::MultiFab((MultiFab *)&mfi,&local_218,this,uVar8,ngcrse,(MFInfo *)local_2d0,
                       (FabFactory<amrex::FArrayBox> *)&local_280);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_2d0 + 0x10));
    BoxArray::~BoxArray(&local_218);
    average_down_faces(fine,(MultiFab *)&mfi,ratio,ngcrse);
    period = Periodicity::NonPeriodic();
    local_2d0._4_4_ = ngcrse;
    local_2d0._0_4_ = ngcrse;
    local_2d0._8_4_ = ngcrse;
    local_218.m_bat.m_bat_type = ngcrse;
    local_218.m_bat.m_op.m_indexType.m_typ.itype = (BATindexType)ngcrse;
    local_218.m_bat.m_op.m_bndryReg.m_typ.itype = (IndexType)ngcrse;
    FabArray<amrex::FArrayBox>::ParallelCopy_nowait
              (&crse->super_FabArray<amrex::FArrayBox>,(FabArray<amrex::FArrayBox> *)&mfi,0,0,uVar8,
               (IntVect *)&local_218,(IntVect *)local_2d0,period,COPY,(CPC *)0x0,false);
    MultiFab::~MultiFab((MultiFab *)&mfi);
  }
  return;
}

Assistant:

void average_down_faces (const MultiFab& fine, MultiFab& crse,
                             const IntVect& ratio, int ngcrse)
    {
        AMREX_ASSERT(crse.nComp() == fine.nComp());
        AMREX_ASSERT(fine.ixType() == crse.ixType());
        const auto type = fine.ixType();
        int dir;
        for (dir = 0; dir < AMREX_SPACEDIM; ++dir) {
            if (type.nodeCentered(dir)) break;
        }
        auto tmptype = type;
        tmptype.unset(dir);
        if (dir >= AMREX_SPACEDIM || !tmptype.cellCentered()) {
            amrex::Abort("average_down_faces: not face index type");
        }
        const int ncomp = crse.nComp();
        if (isMFIterSafe(fine, crse))
        {
#ifdef AMREX_USE_GPU
            if (Gpu::inLaunchRegion() && crse.isFusingCandidate()) {
                auto const& crsema = crse.arrays();
                auto const& finema = fine.const_arrays();
                ParallelFor(crse, IntVect(ngcrse), ncomp,
                [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
                {
                    amrex_avgdown_faces(i,j,k,n, crsema[box_no], finema[box_no], 0, 0, ratio, dir);
                });
                Gpu::streamSynchronize();
            } else
#endif
            {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
                for (MFIter mfi(crse,TilingIfNotGPU()); mfi.isValid(); ++mfi)
                {
                    const Box& bx = mfi.growntilebox(ngcrse);
                    Array4<Real> const& crsearr = crse.array(mfi);
                    Array4<Real const> const& finearr = fine.const_array(mfi);

                    AMREX_HOST_DEVICE_PARALLEL_FOR_4D(bx, ncomp, i, j, k, n,
                    {
                        amrex_avgdown_faces(i,j,k,n, crsearr, finearr, 0, 0, ratio, dir);
                    });
                }
            }
        }
        else
        {
            MultiFab ctmp(amrex::coarsen(fine.boxArray(),ratio), fine.DistributionMap(),
                          ncomp, ngcrse, MFInfo(), FArrayBoxFactory());
            average_down_faces(fine, ctmp, ratio, ngcrse);
            crse.ParallelCopy(ctmp,0,0,ncomp,ngcrse,ngcrse);
        }
    }